

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_integer_width_for_instruction(CompilerGLSL *this,Instruction *instr)

{
  bool bVar1;
  uint uVar2;
  uint32_t id;
  uint32_t *puVar3;
  SPIRType *pSVar4;
  TypedID *this_00;
  SPIRType *type;
  uint32_t *ops;
  Instruction *instr_local;
  CompilerGLSL *this_local;
  
  if (instr->length < 3) {
    return 0x20;
  }
  puVar3 = Compiler::stream(&this->super_Compiler,instr);
  uVar2 = (uint)instr->op;
  if (3 < uVar2 - 0x6f) {
    if (uVar2 - 0x97 < 2) {
      pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,*puVar3);
      this_00 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                          (&(pSVar4->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,0);
      id = TypedID::operator_cast_to_unsigned_int(this_00);
      pSVar4 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
      return pSVar4->width;
    }
    if (9 < uVar2 - 0xaa) {
      pSVar4 = Compiler::maybe_get<spirv_cross::SPIRType>(&this->super_Compiler,*puVar3);
      if ((pSVar4 != (SPIRType *)0x0) && (bVar1 = type_is_integral(pSVar4), bVar1)) {
        return pSVar4->width;
      }
      return 0x20;
    }
  }
  pSVar4 = Compiler::expression_type(&this->super_Compiler,puVar3[2]);
  return pSVar4->width;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_instruction(const Instruction &instr) const
{
	if (instr.length < 3)
		return 32;

	auto *ops = stream(instr);

	switch (instr.op)
	{
	case OpSConvert:
	case OpConvertSToF:
	case OpUConvert:
	case OpConvertUToF:
	case OpIEqual:
	case OpINotEqual:
	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
		return expression_type(ops[2]).width;

	case OpSMulExtended:
	case OpUMulExtended:
		return get<SPIRType>(get<SPIRType>(ops[0]).member_types[0]).width;

	default:
	{
		// We can look at result type which is more robust.
		auto *type = maybe_get<SPIRType>(ops[0]);
		if (type && type_is_integral(*type))
			return type->width;
		else
			return 32;
	}
	}
}